

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsIsCallable(JsValueRef object,bool *isCallable)

{
  anon_class_16_2_c1e6c7bc fn;
  JsErrorCode JVar1;
  bool *local_18;
  bool *isCallable_local;
  JsValueRef object_local;
  
  fn.isCallable = &local_18;
  fn.object = &isCallable_local;
  local_18 = isCallable;
  isCallable_local = (bool *)object;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsIsCallable::__0>(fn,false,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsIsCallable(_In_ JsValueRef object, _Out_ bool *isCallable)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        PARAM_NOT_NULL(isCallable);

        *isCallable = Js::JavascriptConversion::IsCallable(object) && !Js::JavascriptOperators::IsClassConstructor(object);

        return JsNoError;
    });
}